

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::FindIndependentGroups(wasm::InsertOrderedSet<CFG::
Block*>&,wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>&,wasm::
InsertOrderedSet<CFG::Block*>*)::HelperClass::InvalidateWithChildren(CFG::Block__
          (void *this,Block *New)

{
  _Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_CFG::Block_*>,_std::_Select1st<std::pair<CFG::Block_*const,_CFG::Block_*>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
  *this_00;
  bool bVar1;
  mapped_type *ppBVar2;
  InsertOrderedSet<CFG::Block_*> *this_01;
  iterator iVar3;
  _List_node_base *p_Var4;
  list<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  *plVar5;
  Block *local_68;
  Block *New_local;
  BlockList ToInvalidate;
  Block *Owner;
  key_type local_38;
  Block *Invalidatee;
  
  New_local = (Block *)&New_local;
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_68 = New;
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)New_local;
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)New_local,&local_68);
  this_00 = (_Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_CFG::Block_*>,_std::_Select1st<std::pair<CFG::Block_*const,_CFG::Block_*>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
             *)((long)this + 8);
  while (ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
         super__List_node_base._M_prev != (_List_node_base *)0x0) {
    local_38 = (key_type)(New_local->BranchesOut).Map._M_h._M_bucket_count;
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::pop_front
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&New_local);
    ppBVar2 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)this_00,&local_38);
    ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
    _M_size = (size_t)*ppBVar2;
    bVar1 = contains<wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>,CFG::Block*>
                      (*this,(Block **)
                             &ToInvalidate.
                              super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                              _M_node._M_size);
    if (bVar1) {
      this_01 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
                operator[](*this,(Block **)
                                 &ToInvalidate.
                                  super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                                  _M_impl._M_node._M_size);
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(this_01,&local_38);
    }
    ppBVar2 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)this_00,&local_38);
    if (*ppBVar2 != (mapped_type)0x0) {
      ppBVar2 = std::
                map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                              *)this_00,&local_38);
      *ppBVar2 = (mapped_type)0x0;
      plVar5 = &(local_38->BranchesOut).List;
      p_Var4 = (_List_node_base *)plVar5;
      while (p_Var4 = (((_List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
                         *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)plVar5) {
        iVar3 = std::
                _Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_CFG::Block_*>,_std::_Select1st<std::pair<CFG::Block_*const,_CFG::Block_*>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                ::find(this_00,(key_type *)(p_Var4 + 1));
        if ((iVar3._M_node != (_Base_ptr)((long)this + 0x10)) &&
           (iVar3._M_node[1]._M_parent != (_Base_ptr)0x0)) {
          std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
                    ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&New_local,
                     (value_type *)(p_Var4 + 1));
        }
      }
    }
  }
  std::__cxx11::_List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>::_M_clear
            ((_List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&New_local);
  return;
}

Assistant:

void InvalidateWithChildren(Block* New) { // TODO: rename New
          // Being in the list means you need to be invalidated
          BlockList ToInvalidate;
          ToInvalidate.push_back(New);
          while (ToInvalidate.size() > 0) {
            Block* Invalidatee = ToInvalidate.front();
            ToInvalidate.pop_front();
            Block* Owner = Ownership[Invalidatee];
            // Owner may have been invalidated, do not add to IndependentGroups!
            if (contains(IndependentGroups, Owner)) {
              IndependentGroups[Owner].erase(Invalidatee);
            }
            // may have been seen before and invalidated already
            if (Ownership[Invalidatee]) {
              Ownership[Invalidatee] = nullptr;
              for (auto& [Target, _] : Invalidatee->BranchesOut) {
                auto Known = Ownership.find(Target);
                if (Known != Ownership.end()) {
                  Block* TargetOwner = Known->second;
                  if (TargetOwner) {
                    ToInvalidate.push_back(Target);
                  }
                }
              }
            }
          }
        }